

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_copy(roaring_bitmap_t *r)

{
  _Bool _Var1;
  roaring_array_t *in_RDI;
  roaring_bitmap_t *ans;
  undefined1 in_stack_ffffffffffffffcf;
  roaring_array_t *in_stack_ffffffffffffffd0;
  roaring_bitmap_t *r_00;
  roaring_array_t *in_stack_ffffffffffffffd8;
  roaring_array_t *source;
  undefined8 local_8;
  
  local_8 = (roaring_bitmap_t *)roaring_malloc(0x133ad3);
  if (local_8 == (roaring_bitmap_t *)0x0) {
    local_8 = (roaring_bitmap_t *)0x0;
  }
  else {
    _Var1 = ra_init_with_capacity
                      (in_stack_ffffffffffffffd8,
                       (uint32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    if (_Var1) {
      source = in_RDI;
      is_cow((roaring_bitmap_t *)in_RDI);
      _Var1 = ra_overwrite(source,in_stack_ffffffffffffffd0,(_Bool)in_stack_ffffffffffffffcf);
      if (_Var1) {
        r_00 = local_8;
        _Var1 = is_cow((roaring_bitmap_t *)in_RDI);
        roaring_bitmap_set_copy_on_write(r_00,_Var1);
      }
      else {
        roaring_bitmap_free((roaring_bitmap_t *)0x133b59);
        local_8 = (roaring_bitmap_t *)0x0;
      }
    }
    else {
      roaring_free((void *)0x133b0d);
      local_8 = (roaring_bitmap_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_copy(const roaring_bitmap_t *r) {
    roaring_bitmap_t *ans =
        (roaring_bitmap_t *)roaring_malloc(sizeof(roaring_bitmap_t));
    if (!ans) {
        return NULL;
    }
    if (!ra_init_with_capacity(  // allocation of list of containers can fail
            &ans->high_low_container, r->high_low_container.size)) {
        roaring_free(ans);
        return NULL;
    }
    if (!ra_overwrite(  // memory allocation of individual containers may fail
            &r->high_low_container, &ans->high_low_container, is_cow(r))) {
        roaring_bitmap_free(ans);  // overwrite should leave in freeable state
        return NULL;
    }
    roaring_bitmap_set_copy_on_write(ans, is_cow(r));
    return ans;
}